

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# self_test_core.c
# Opt level: O0

void self_test_setparams(OSSL_SELF_TEST *st)

{
  char *buf;
  char *key;
  long lVar1;
  void *__dest;
  long lVar2;
  long in_RDI;
  size_t n;
  size_t in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff40;
  undefined1 local_b0 [40];
  undefined1 local_88 [40];
  undefined1 local_60 [40];
  undefined1 local_38 [40];
  long local_10;
  long local_8;
  
  local_10 = 0;
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x18) != 0) {
    buf = (char *)(in_RDI + 0x20);
    local_10 = 1;
    OSSL_PARAM_construct_utf8_string(in_stack_ffffffffffffff40,buf,in_stack_ffffffffffffff30);
    memcpy(buf,local_38,0x28);
    key = (char *)(local_8 + 0x20 + local_10 * 0x28);
    local_10 = local_10 + 1;
    OSSL_PARAM_construct_utf8_string(key,buf,in_stack_ffffffffffffff30);
    memcpy(key,local_60,0x28);
    lVar1 = local_8 + 0x20;
    lVar2 = local_10 * 0x28;
    local_10 = local_10 + 1;
    OSSL_PARAM_construct_utf8_string(key,buf,in_stack_ffffffffffffff30);
    memcpy((void *)(lVar1 + lVar2),local_88,0x28);
  }
  __dest = (void *)(local_8 + 0x20 + local_10 * 0x28);
  local_10 = local_10 + 1;
  OSSL_PARAM_construct_end();
  memcpy(__dest,local_b0,0x28);
  return;
}

Assistant:

static void self_test_setparams(OSSL_SELF_TEST *st)
{
    size_t n = 0;

    if (st->cb != NULL) {
        st->params[n++] =
            OSSL_PARAM_construct_utf8_string(OSSL_PROV_PARAM_SELF_TEST_PHASE,
                                             (char *)st->phase, 0);
        st->params[n++] =
            OSSL_PARAM_construct_utf8_string(OSSL_PROV_PARAM_SELF_TEST_TYPE,
                                             (char *)st->type, 0);
        st->params[n++] =
            OSSL_PARAM_construct_utf8_string(OSSL_PROV_PARAM_SELF_TEST_DESC,
                                             (char *)st->desc, 0);
    }
    st->params[n++] = OSSL_PARAM_construct_end();
}